

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::utp_socket_impl::maybe_trigger_send_callback(utp_socket_impl *this,error_code *ec)

{
  int iVar1;
  pointer psVar2;
  error_code *peVar3;
  error_code error_to_report;
  error_code local_18;
  
  if (this->m_write_handler != false) {
    iVar1 = this->m_written;
    if ((long)iVar1 != 0 || (ec->failed_ & 1U) != 0) {
      peVar3 = &this->m_error;
      if ((ec->failed_ & 1U) != 0) {
        peVar3 = ec;
      }
      this->m_write_handler = false;
      if (iVar1 == 0) {
        peVar3 = ec;
      }
      local_18.val_ = peVar3->val_;
      local_18.failed_ = peVar3->failed_;
      local_18._5_3_ = *(undefined3 *)&peVar3->field_0x5;
      local_18.cat_ = peVar3->cat_;
      utp_stream::on_write(this->m_userdata,(long)iVar1,&local_18,false);
      this->m_write_buffer_size = 0;
      this->m_written = 0;
      psVar2 = (this->m_write_buffer).
               super__Vector_base<libtorrent::span<const_char>,_std::allocator<libtorrent::span<const_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_write_buffer).
          super__Vector_base<libtorrent::span<const_char>,_std::allocator<libtorrent::span<const_char>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != psVar2) {
        (this->m_write_buffer).
        super__Vector_base<libtorrent::span<const_char>,_std::allocator<libtorrent::span<const_char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = psVar2;
      }
      if (((*(ushort *)&this->field_0x21c & 0x5c) == 0x48) &&
         ((this->m_nagle_packet)._M_t.
          super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>._M_t.
          super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
          super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl == (packet *)0x0)) {
        send_fin(this);
      }
    }
  }
  return;
}

Assistant:

void utp_socket_impl::maybe_trigger_send_callback(error_code const& ec)
{
	INVARIANT_CHECK;

	if (m_write_handler == false) return;

	// nothing has been written
	if (m_written == 0 && !ec) return;

	UTP_LOGV("%8p: calling write handler written:%d\n", static_cast<void*>(this), m_written);

	m_write_handler = false;
	error_code const error_to_report = ec ? ec : m_error;
	utp_stream::on_write(m_userdata, aux::numeric_cast<std::size_t>(m_written), error_to_report, false);
	m_written = 0;
	m_write_buffer_size = 0;
	m_write_buffer.clear();
	if (m_out_eof
		&& !m_nagle_packet
		&& state() == state_t::connected)
		send_fin();
}